

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogSink.cpp
# Opt level: O3

void __thiscall gnilk::LogSink::OnAttached(LogSink *this)

{
  LogManager *this_00;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this_00 = LogManager::Instance();
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_gnilk::LogEvent_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/LogSink.cpp:14:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_gnilk::LogEvent_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/LogSink.cpp:14:41)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  LogManager::IterateCache(this_00,(CachedEventDelgate *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void LogSink::OnAttached() {
    LogManager::Instance().IterateCache([this](const LogEvent &event) -> bool {
        if (WithinRange(event.Level())) {
            if (Write(event) < 0) {
                return false;
            }
        }
        return true;
    });
}